

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-job.cc
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  string *psVar2;
  element_type *peVar3;
  ostream *poVar4;
  exception *e_2;
  string local_1d0 [32];
  QPDFJob local_1b0 [8];
  QPDFJob j_2;
  exception *e_1;
  QPDFJob j_1;
  char *local_188;
  char *new_argv [11];
  exception *e;
  string local_118 [39];
  allocator<char> local_f1;
  string local_f0 [39];
  allocator<char> local_c9;
  string local_c8 [39];
  allocator<char> local_a1;
  string local_a0 [39];
  allocator<char> local_79;
  string local_78 [32];
  shared_ptr<QPDFJob::Config> local_58;
  shared_ptr<QPDFJob::PagesConfig> local_48 [2];
  QPDFJob local_28 [8];
  QPDFJob j;
  char **argv_local;
  int argc_local;
  
  whoami = (char *)QUtil::getWhoami(*argv);
  if (argc != 1) {
    usage();
  }
  QPDFJob::QPDFJob(local_28);
  QPDFJob::config();
  psVar2 = (string *)
           std::__shared_ptr_access<QPDFJob::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_78,"in.pdf",&local_79);
  psVar2 = (string *)QPDFJob::Config::inputFile(psVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a0,"out1.pdf",&local_a1);
  QPDFJob::Config::outputFile(psVar2);
  QPDFJob::Config::pages();
  peVar3 = std::__shared_ptr_access<QPDFJob::PagesConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<QPDFJob::PagesConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c8,".",&local_c9);
  psVar2 = (string *)QPDFJob::PagesConfig::file((string *)peVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f0,"1",&local_f1);
  QPDFJob::PagesConfig::range(psVar2);
  QPDFJob::PagesConfig::endPages();
  QPDFJob::Config::linearize();
  psVar2 = (string *)QPDFJob::Config::staticId();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_118,"n",(allocator<char> *)((long)&e + 7));
  QPDFJob::Config::compressStreams(psVar2);
  QPDFJob::Config::checkConfiguration();
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator(&local_f1);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator(&local_c9);
  std::shared_ptr<QPDFJob::PagesConfig>::~shared_ptr(local_48);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator(&local_79);
  std::shared_ptr<QPDFJob::Config>::~shared_ptr(&local_58);
  QPDFJob::run();
  poVar4 = std::operator<<((ostream *)&std::cout,"out1 status: ");
  iVar1 = QPDFJob::getExitCode();
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  QPDFJob::~QPDFJob(local_28);
  local_188 = whoami;
  new_argv[0] = "in.pdf";
  new_argv[1] = "out2.pdf";
  new_argv[2] = "--linearize";
  new_argv[3] = "--pages";
  new_argv[4] = ".";
  new_argv[5] = "1";
  new_argv[6] = "--";
  new_argv[7] = "--static-id";
  new_argv[8] = "--compress-streams=n";
  new_argv[9] = (char *)0x0;
  QPDFJob::QPDFJob((QPDFJob *)&e_1);
  QPDFJob::initializeFromArgv((char **)&e_1,(char *)&local_188);
  QPDFJob::run();
  poVar4 = std::operator<<((ostream *)&std::cout,"out2 status: ");
  iVar1 = QPDFJob::getExitCode();
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  QPDFJob::~QPDFJob((QPDFJob *)&e_1);
  QPDFJob::QPDFJob(local_1b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1d0,
             "{\n  \"inputFile\": \"in.pdf\",\n  \"outputFile\": \"out3.pdf\",\n  \"staticId\": \"\",\n  \"linearize\": \"\",\n  \"compressStreams\": \"n\",\n  \"pages\": [\n    {\n      \"file\": \".\",\n      \"range\": \"1\"\n    }\n  ]\n}\n"
             ,(allocator<char> *)((long)&e_2 + 7));
  QPDFJob::initializeFromJson((string *)local_1b0,SUB81(local_1d0,0));
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e_2 + 7));
  QPDFJob::run();
  poVar4 = std::operator<<((ostream *)&std::cout,"out3 status: ");
  iVar1 = QPDFJob::getExitCode();
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  QPDFJob::~QPDFJob(local_1b0);
  return 0;
}

Assistant:

int
main(int argc, char* argv[])
{
    whoami = QUtil::getWhoami(argv[0]);

    if (argc != 1) {
        usage();
    }

    // The examples below all catch std::exception. Note that QPDFUsage can be caught separately to
    // report on errors in using the API itself. For CLI, this is command-line usage. For JSON or
    // the API, it would be errors from the equivalent invocation.

    // Note that staticId is used for testing only.

    try {
        // Use the config API
        QPDFJob j;
        j.config()
            ->inputFile("in.pdf")
            ->outputFile("out1.pdf")
            ->pages()
            // Prior to qpdf 11.9.0, call ->pageSpec(file, range, password)
            ->file(".")
            ->range("1")
            ->endPages()
            ->linearize()
            ->staticId()           // for testing only
            ->compressStreams("n") // avoid dependency on zlib output
            ->checkConfiguration();
        j.run();
        std::cout << "out1 status: " << j.getExitCode() << std::endl;
    } catch (std::exception& e) {
        std::cerr << "exception: " << e.what() << std::endl;
        return 2;
    }

    try {
        char const* new_argv[] = {
            whoami,
            "in.pdf",
            "out2.pdf",
            "--linearize",
            "--pages",
            ".",
            "1",
            "--",
            "--static-id",
            "--compress-streams=n", // avoid dependency on zlib output
            nullptr};
        QPDFJob j;
        j.initializeFromArgv(new_argv);
        j.run();
        std::cout << "out2 status: " << j.getExitCode() << std::endl;
    } catch (std::exception& e) {
        std::cerr << "exception: " << e.what() << std::endl;
        return 2;
    }

    try {
        // Use the JSON API
        QPDFJob j;
        j.initializeFromJson(R"({
  "inputFile": "in.pdf",
  "outputFile": "out3.pdf",
  "staticId": "",
  "linearize": "",
  "compressStreams": "n",
  "pages": [
    {
      "file": ".",
      "range": "1"
    }
  ]
}
)");
        j.run();
        std::cout << "out3 status: " << j.getExitCode() << std::endl;
    } catch (std::exception& e) {
        std::cerr << "exception: " << e.what() << std::endl;
        return 2;
    }

    return 0;
}